

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O0

vanilla_chronicle_settings * __thiscall
cornelich::vanilla_chronicle_settings::cycle_length
          (vanilla_chronicle_settings *this,int32_t cycle_length,
          shared_ptr<cornelich::cycle_formatter> *formatter,bool check)

{
  int64_t iVar1;
  invalid_argument *this_00;
  streamer *psVar2;
  int64_t local_1e8 [3];
  streamer local_1d0;
  undefined1 local_48 [47];
  bool check_local;
  shared_ptr<cornelich::cycle_formatter> *formatter_local;
  vanilla_chronicle_settings *pvStack_10;
  int32_t cycle_length_local;
  vanilla_chronicle_settings *this_local;
  
  local_48[0x27] = check;
  unique0x10000141 = formatter;
  formatter_local._4_4_ = cycle_length;
  pvStack_10 = this;
  if (check) {
    iVar1 = min_cycle_length();
    if (cycle_length < iVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      util::streamer::streamer(&local_1d0);
      psVar2 = util::streamer::operator<<
                         (&local_1d0,(char (*) [38])"Cycle length [ms] can\'t be less than ");
      local_1e8[0] = min_cycle_length();
      psVar2 = util::streamer::operator<<(psVar2,local_1e8);
      util::streamer::operator<<(psVar2,(char (*) [4])" ms");
      util::streamer::operator_cast_to_string((streamer *)local_48);
      std::invalid_argument::invalid_argument(this_00,(string *)local_48);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  this->m_cycle_length = formatter_local._4_4_;
  std::shared_ptr<cornelich::cycle_formatter>::operator=
            (&this->m_cycle_format,stack0xffffffffffffffe0);
  return this;
}

Assistant:

vanilla_chronicle_settings & vanilla_chronicle_settings::cycle_length(const std::int32_t cycle_length, const std::shared_ptr<cycle_formatter> & formatter, bool check)
{
    if(check && cycle_length < min_cycle_length())
        throw std::invalid_argument(util::streamer() << "Cycle length [ms] can't be less than " << min_cycle_length() << " ms");
    m_cycle_length = cycle_length;
    m_cycle_format = formatter;
    return *this;
}